

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void helper_mac_set_flags_m68k(CPUM68KState_conflict *env,uint32_t acc)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = env->macc[acc];
  if (uVar1 == 0) {
    uVar2 = env->macsr | 4;
  }
  else {
    uVar2 = env->macsr;
    if ((uVar1 >> 0x2f & 1) == 0) goto LAB_0066c9d3;
    uVar2 = uVar2 | 8;
  }
  env->macsr = uVar2;
LAB_0066c9d3:
  if (((uVar2 >> ((byte)acc & 0x1f)) >> 8 & 1) != 0) {
    uVar2 = uVar2 | 2;
    env->macsr = uVar2;
  }
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x40) == 0) {
      if (uVar1 >> 0x20 == 0) {
        return;
      }
    }
    else if (0x7ffffffe < (uint)(uVar1 - 0x100000000 >> 0x21)) {
      return;
    }
  }
  else if (0x7ffffe < (uint)(uVar1 - 0x10000000000 >> 0x29)) {
    return;
  }
  env->macsr = uVar2 | 1;
  return;
}

Assistant:

void HELPER(mac_set_flags)(CPUM68KState *env, uint32_t acc)
{
    uint64_t val;
    val = env->macc[acc];
    if (val == 0) {
        env->macsr |= MACSR_Z;
    } else if (val & (1ull << 47)) {
        env->macsr |= MACSR_N;
    }
    if (env->macsr & (MACSR_PAV0 << acc)) {
        env->macsr |= MACSR_V;
    }
    if (env->macsr & MACSR_FI) {
        val = ((int64_t)val) >> 40;
        if (val != 0 && val != -1)
            env->macsr |= MACSR_EV;
    } else if (env->macsr & MACSR_SU) {
        val = ((int64_t)val) >> 32;
        if (val != 0 && val != -1)
            env->macsr |= MACSR_EV;
    } else {
        if ((val >> 32) != 0)
            env->macsr |= MACSR_EV;
    }
}